

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O2

String * String::toHex(String *__return_storage_ptr__,void *pAddressIn,size_t lSize)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  byte bVar4;
  void *pvVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  char szBuf [100];
  
  (__return_storage_ptr__->mString)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mString).field_2;
  (__return_storage_ptr__->mString)._M_string_length = 0;
  (__return_storage_ptr__->mString).field_2._M_local_buf[0] = '\0';
  pvVar5 = pAddressIn;
  while (uVar8 = (uint)lSize, uVar8 != 0) {
    uVar2 = 0x10;
    if ((int)uVar8 < 0x10) {
      uVar2 = uVar8;
    }
    snprintf(szBuf,100," >                                                      %08lX",
             (long)pvVar5 - (long)pAddressIn);
    uVar7 = uVar8;
    if (0xf < (int)uVar8) {
      uVar7 = 0x10;
    }
    iVar9 = 2;
    for (lVar6 = 0; uVar7 != (uint)lVar6; lVar6 = lVar6 + 1) {
      bVar1 = *(byte *)((long)pvVar5 + lVar6);
      sprintf(szBuf + iVar9,"%02X ",(ulong)bVar1);
      iVar3 = isprint((uint)bVar1);
      bVar4 = 0x2e;
      if (iVar3 != 0) {
        bVar4 = bVar1;
      }
      szBuf[lVar6 + 0x27] = bVar4;
      iVar3 = iVar9;
      if (((uint)lVar6 + 1 & 3) == 0) {
        iVar3 = iVar9 + 1;
        szBuf[(long)iVar9 + 3] = ' ';
      }
      iVar9 = iVar3 + 2;
    }
    (szBuf + (int)(iVar9 - (uint)((uVar2 & 3) == 0)))[0] = '<';
    (szBuf + (int)(iVar9 - (uint)((uVar2 & 3) == 0)))[1] = ' ';
    append(__return_storage_ptr__,szBuf,0xffffffffffffffff);
    pvVar5 = (void *)((long)pvVar5 + (long)(int)uVar2);
    lSize = (size_t)(uVar8 - uVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

String String::toHex(const void *pAddressIn, size_t lSize)
{
    String ret;
    char szBuf[100];
    int lIndent = 1;
    int lOutLen, lIndex, lIndex2, lOutLen2;
    int lRelPos;
    struct {
        const unsigned char *pData;
        unsigned int lSize;
    } buf;
    const unsigned char *pTmp;
    unsigned char ucTmp;
    const unsigned char *pAddress = static_cast<const unsigned char *>(pAddressIn);

    buf.pData = pAddress;
    buf.lSize = lSize;

    while (buf.lSize > 0) {
        pTmp = buf.pData;
        lOutLen = (int)buf.lSize;
        if (lOutLen > 16)
            lOutLen = 16;

        // create a 64-character formatted output line:
        snprintf(szBuf,
                 sizeof(szBuf),
                 " >                            "
                 "                      "
                 "    %08lX",
                 static_cast<long unsigned int>(pTmp - pAddress));
        lOutLen2 = lOutLen;

        for (lIndex = 1 + lIndent, lIndex2 = 53 - 15 + lIndent, lRelPos = 0; lOutLen2; lOutLen2--, lIndex += 2, lIndex2++) {
            ucTmp = *pTmp++;

            sprintf(szBuf + lIndex, "%02X ", (unsigned short)ucTmp);
            if (!isprint(ucTmp))
                ucTmp = '.'; // nonprintable char
            szBuf[lIndex2] = ucTmp;

            if (!(++lRelPos & 3)) // extra blank after 4 bytes
            {
                lIndex++;
                szBuf[lIndex + 2] = ' ';
            }
        }

        if (!(lRelPos & 3))
            lIndex--;

        szBuf[lIndex] = '<';
        szBuf[lIndex + 1] = ' ';

        ret.append(szBuf);

        buf.pData += lOutLen;
        buf.lSize -= lOutLen;
    }
    return ret;
}